

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
emplace_back<slang::syntax::ExpressionSyntax_const*>
          (SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *this,ExpressionSyntax **args)

{
  reference ppEVar1;
  ulong uVar2;
  long lVar3;
  reference __dest;
  size_t __n;
  undefined8 *puVar4;
  undefined8 *__src;
  reference __dest_00;
  ulong capacity;
  
  lVar3 = *(long *)(this + 8);
  puVar4 = (undefined8 *)(lVar3 * 8 + *(long *)this);
  if (lVar3 != *(long *)(this + 0x10)) {
    *puVar4 = *args;
    lVar3 = lVar3 + 1;
    *(long *)(this + 8) = lVar3;
    if (lVar3 != 0) {
      return (reference)(*(long *)this + lVar3 * 8 + -8);
    }
    assert::assertFailed
              ("len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x62,
               "reference slang::SmallVectorBase<const slang::syntax::ExpressionSyntax *>::back() [T = const slang::syntax::ExpressionSyntax *]"
              );
  }
  if (*(long *)(this + 8) == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = *(long *)(this + 8) + 1;
  uVar2 = *(ulong *)(this + 0x10);
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar3 = *(long *)this;
  __dest = (reference)detail::allocArray(capacity,8);
  ppEVar1 = (reference)((long)__dest + ((long)puVar4 - lVar3));
  *(ExpressionSyntax **)((long)__dest + ((long)puVar4 - lVar3)) = *args;
  __src = *(undefined8 **)this;
  lVar3 = *(long *)(this + 8);
  if (__src + lVar3 == puVar4) {
    if (lVar3 == 0) goto LAB_001c2fd7;
    __n = lVar3 << 3;
    __dest_00 = __dest;
  }
  else {
    if (__src != puVar4) {
      memmove(__dest,__src,(long)puVar4 - (long)__src);
    }
    __n = (*(long *)(this + 8) * 8 + *(long *)this) - (long)puVar4;
    if (__n == 0) goto LAB_001c2fd7;
    __src = puVar4;
    __dest_00 = ppEVar1 + 1;
  }
  memmove(__dest_00,__src,__n);
LAB_001c2fd7:
  if (*(SmallVectorBase<slang::syntax::ExpressionSyntax_const*> **)this != this + 0x18) {
    free(*(SmallVectorBase<slang::syntax::ExpressionSyntax_const*> **)this);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = capacity;
  *(reference *)this = __dest;
  return ppEVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }